

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O1

QFusionStyle * __thiscall
QFusionStyle::standardPixmap
          (QFusionStyle *this,StandardPixmap standardPixmap,QStyleOption *opt,QWidget *widget)

{
  long in_R8;
  long in_FS_OFFSET;
  double dVar1;
  QIcon icon;
  QArrayData *local_58 [2];
  long local_48;
  QFusionStyle local_40;
  
  local_40.super_QCommonStyle.super_QStyle._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_40.super_QCommonStyle.super_QStyle._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  iconFromTheme(&local_40,standardPixmap);
  QIcon::availableSizes((Mode)local_58,(State)&local_40);
  if (local_58[0] != (QArrayData *)0x0) {
    LOCK();
    (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58[0],8,0x10);
    }
  }
  if (local_48 == 0) {
    QCommonStyle::standardPixmap
              (&this->super_QCommonStyle,standardPixmap,(QStyleOption *)((ulong)opt & 0xffffffff),
               widget);
  }
  else {
    local_58[0] = (QArrayData *)0x1000000010;
    if (in_R8 == 0) {
      dVar1 = (double)QGuiApplication::devicePixelRatio();
    }
    else {
      dVar1 = (double)QPaintDevice::devicePixelRatio();
    }
    QIcon::pixmap((QSize *)this,dVar1,(Mode)&local_40,(State)local_58);
  }
  QIcon::~QIcon((QIcon *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_40.super_QCommonStyle.super_QStyle._8_8_) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QFusionStyle::standardPixmap(StandardPixmap standardPixmap, const QStyleOption *opt,
                                     const QWidget *widget) const
{
    const auto icon = iconFromTheme(standardPixmap);
    if (!icon.availableSizes().isEmpty())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));
    return QCommonStyle::standardPixmap(standardPixmap, opt, widget);
}